

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VEnableDotProdMulti_Serial(N_Vector v,int tf)

{
  N_Vector_Ops p_Var1;
  int iVar2;
  code *pcVar3;
  
  iVar2 = -1;
  if ((v != (N_Vector)0x0) && (p_Var1 = v->ops, p_Var1 != (N_Vector_Ops)0x0)) {
    iVar2 = 0;
    if (tf == 0) {
      pcVar3 = (_func_int_int_N_Vector_N_Vector_ptr_realtype_ptr *)0x0;
    }
    else {
      pcVar3 = N_VDotProdMulti_Serial;
    }
    p_Var1->nvdotprodmulti = pcVar3;
    p_Var1->nvdotprodmultilocal = pcVar3;
  }
  return iVar2;
}

Assistant:

int N_VEnableDotProdMulti_Serial(N_Vector v, booleantype tf)
{
  /* check that vector is non-NULL */
  if (v == NULL) return(-1);

  /* check that ops structure is non-NULL */
  if (v->ops == NULL) return(-1);

  /* enable/disable operation */
  if (tf) {
    v->ops->nvdotprodmulti      = N_VDotProdMulti_Serial;
    v->ops->nvdotprodmultilocal = N_VDotProdMulti_Serial;
  } else {
    v->ops->nvdotprodmulti      = NULL;
    v->ops->nvdotprodmultilocal = NULL;
  }

  /* return success */
  return(0);
}